

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

int __thiscall helics::Input::getValue(Input *this,double *data,int maxsize)

{
  size_type sVar1;
  int *piVar2;
  double *__src;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int length;
  vector<double,_std::allocator<double>_> *V;
  Input *in_stack_000000c0;
  int local_28;
  int local_24;
  vector<double,_std::allocator<double>_> *local_20;
  int local_14;
  void *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = getValueRef<std::vector<double,std::allocator<double>>>(in_stack_000000c0);
  local_24 = 0;
  if ((local_10 != (void *)0x0) && (0 < local_14)) {
    sVar1 = CLI::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_20);
    local_28 = (int)sVar1;
    piVar2 = CLI::std::min<int>(&local_28,&local_14);
    local_24 = *piVar2;
    __src = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x36ab23);
    memmove(local_10,__src,(long)local_24 << 3);
  }
  *(undefined1 *)(in_RDI + 0x59) = 0;
  return local_24;
}

Assistant:

int Input::getValue(double* data, int maxsize)
{
    const auto& V = getValueRef<std::vector<double>>();
    int length = 0;
    if (data != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(V.size()), maxsize);
        std::memmove(data, V.data(), length * sizeof(double));
    }

    hasUpdate = false;
    return length;
}